

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RayTracerConfig.cpp
# Opt level: O0

ostream * operator<<(ostream *out,RayTracerConfig *config)

{
  bool bVar1;
  ostream *poVar2;
  reference sphere_00;
  reference plane_00;
  reference triangle_00;
  Triangle *triangle;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  vector<Triangle,_std::allocator<Triangle>_> *__range1_2;
  Plane *plane;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<Plane,_std::allocator<Plane>_> *__range1_1;
  Sphere *sphere;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Sphere,_std::allocator<Sphere>_> *__range1;
  RayTracerConfig *config_local;
  ostream *out_local;
  
  poVar2 = std::operator<<(out,"antiAliasing: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(config->super_BaseConfig).antiAliasing);
  poVar2 = std::operator<<(poVar2,"\nmaxRecursionLevel: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(config->super_BaseConfig).maxRecursionLevel);
  poVar2 = std::operator<<(poVar2,"\nambientCoefficient: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(config->super_BaseConfig).ambientCoefficient)
  ;
  poVar2 = std::operator<<(poVar2,"\nimageX: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(config->super_BaseConfig).imageX);
  poVar2 = std::operator<<(poVar2,"\nimageY: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(config->super_BaseConfig).imageY);
  poVar2 = std::operator<<(poVar2,"\nimageZ: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(config->super_BaseConfig).imageZ);
  poVar2 = std::operator<<(poVar2,"\nobserver: ");
  poVar2 = operator<<(poVar2,&(config->super_BaseConfig).observer);
  poVar2 = std::operator<<(poVar2,"\nlight: ");
  operator<<(poVar2,&(config->super_BaseConfig).light);
  std::operator<<(out,"\nspheres:\n");
  __end1 = std::vector<Sphere,_std::allocator<Sphere>_>::begin(&config->spheres);
  sphere = (Sphere *)std::vector<Sphere,_std::allocator<Sphere>_>::end(&config->spheres);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_Sphere_*,_std::vector<Sphere,_std::allocator<Sphere>_>_>
                                *)&sphere);
    if (!bVar1) break;
    sphere_00 = __gnu_cxx::
                __normal_iterator<const_Sphere_*,_std::vector<Sphere,_std::allocator<Sphere>_>_>::
                operator*(&__end1);
    poVar2 = operator<<(out,sphere_00);
    std::operator<<(poVar2,'\n');
    __gnu_cxx::__normal_iterator<const_Sphere_*,_std::vector<Sphere,_std::allocator<Sphere>_>_>::
    operator++(&__end1);
  }
  std::operator<<(out,"planes:\n");
  __end1_1 = std::vector<Plane,_std::allocator<Plane>_>::begin(&config->planes);
  plane = (Plane *)std::vector<Plane,_std::allocator<Plane>_>::end(&config->planes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<const_Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>
                        *)&plane);
    if (!bVar1) break;
    plane_00 = __gnu_cxx::
               __normal_iterator<const_Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>::
               operator*(&__end1_1);
    poVar2 = operator<<(out,plane_00);
    std::operator<<(poVar2,'\n');
    __gnu_cxx::__normal_iterator<const_Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>::
    operator++(&__end1_1);
  }
  std::operator<<(out,"planes:\n");
  __end1_2 = std::vector<Triangle,_std::allocator<Triangle>_>::begin(&config->triangles);
  triangle = (Triangle *)std::vector<Triangle,_std::allocator<Triangle>_>::end(&config->triangles);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_2,
                       (__normal_iterator<const_Triangle_*,_std::vector<Triangle,_std::allocator<Triangle>_>_>
                        *)&triangle);
    if (!bVar1) break;
    triangle_00 = __gnu_cxx::
                  __normal_iterator<const_Triangle_*,_std::vector<Triangle,_std::allocator<Triangle>_>_>
                  ::operator*(&__end1_2);
    poVar2 = operator<<(out,triangle_00);
    std::operator<<(poVar2,'\n');
    __gnu_cxx::
    __normal_iterator<const_Triangle_*,_std::vector<Triangle,_std::allocator<Triangle>_>_>::
    operator++(&__end1_2);
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, RayTracerConfig const& config)
{
  out << "antiAliasing: " << config.antiAliasing
      << "\nmaxRecursionLevel: " << config.maxRecursionLevel
      << "\nambientCoefficient: " << config.ambientCoefficient << "\nimageX: " << config.imageX
      << "\nimageY: " << config.imageY << "\nimageZ: " << config.imageZ
      << "\nobserver: " << config.observer << "\nlight: " << config.light;
  out << "\nspheres:\n";
  for (Sphere const& sphere : config.spheres)
    out << sphere << '\n';
  out << "planes:\n";
  for (Plane const& plane : config.planes)
    out << plane << '\n';
  out << "planes:\n";
  for (Triangle const& triangle : config.triangles)
    out << triangle << '\n';
  return out;
}